

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas.c
# Opt level: O1

doublereal Wnrm2_(integer *n,doublereal *x,integer *incx)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  doublereal dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  Wnrm2_::scale = 0.0;
  iVar2 = *n;
  lVar6 = (long)iVar2;
  iVar3 = *incx;
  lVar7 = (long)iVar3;
  bVar4 = 0 < lVar6;
  if (lVar7 < 0) {
    bVar4 = lVar6 < 2;
  }
  if (bVar4) {
    Wnrm2_::scale = 0.0;
    lVar8 = 0;
    do {
      lVar1 = lVar7 + 1 + lVar8;
      dVar10 = x[lVar8];
      uVar9 = -(ulong)(-dVar10 <= dVar10);
      dVar10 = (double)(~uVar9 & (ulong)-dVar10 | (ulong)dVar10 & uVar9);
      uVar9 = -(ulong)(dVar10 <= Wnrm2_::scale);
      Wnrm2_::scale = (doublereal)(uVar9 & (ulong)Wnrm2_::scale | ~uVar9 & (ulong)dVar10);
      bVar4 = lVar1 <= lVar6;
      if (iVar3 < 0) {
        bVar4 = lVar6 <= lVar1;
      }
      lVar8 = lVar8 + lVar7;
    } while (bVar4);
  }
  dVar5 = Wnrm2_::scale;
  dVar10 = 0.0;
  if ((Wnrm2_::scale == 0.0) && (!NAN(Wnrm2_::scale))) {
    return dVar10;
  }
  bVar4 = 0 < iVar2;
  if (iVar3 < 0) {
    bVar4 = iVar2 < 2;
  }
  if (bVar4) {
    lVar8 = 0;
    do {
      lVar1 = lVar7 + 1 + lVar8;
      dVar10 = dVar10 + (x[lVar8] / Wnrm2_::scale) * (x[lVar8] / Wnrm2_::scale);
      bVar4 = lVar1 <= lVar6;
      if (iVar3 < 0) {
        bVar4 = lVar6 <= lVar1;
      }
      lVar8 = lVar8 + lVar7;
    } while (bVar4);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  return dVar5 * dVar10;
}

Assistant:

doublereal dnrm2_(integer *n, doublereal *x, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;
    doublereal ret_val, d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer i__;
    static doublereal scale;

/*     ********** */

/*     Function dnrm2 */

/*     Given a vector x of length n, this function calculates the */
/*     Euclidean norm of x with stride incx. */

/*     The function statement is */

/*       double precision function dnrm2(n,x,incx) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*       incx is a positive integer variable that specifies the */
/*         stride of the vector. */

/*     Subprograms called */

/*       FORTRAN-supplied ... abs, max, sqrt */

/*     MINPACK-2 Project. February 1991. */
/*     Argonne National Laboratory. */
/*     Brett M. Averick. */

/*     ********** */
    /* Parameter adjustments */
    --x;

    /* Function Body */
    ret_val = 0.;
    scale = 0.;
    i__1 = *n;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
/* Computing MAX */
	d__2 = scale, d__3 = (d__1 = x[i__], abs(d__1));
	scale = max(d__2,d__3);
/* L10: */
    }
    if (scale == 0.) {
	return ret_val;
    }
    i__2 = *n;
    i__1 = *incx;
    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
/* Computing 2nd power */
	d__1 = x[i__] / scale;
	ret_val += d__1 * d__1;
/* L20: */
    }
    ret_val = scale * sqrt(ret_val);
    return ret_val;
}